

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

char * Wlc_PrsReadConstant(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins,int *pRange,int *pSigned,
                          int *pXValue)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  char *format;
  ulong uVar9;
  
  uVar2 = atoi(pStr);
  *pRange = -1;
  *pSigned = 0;
  *pXValue = 0;
  pcVar5 = Wlc_PrsSkipSpaces(pStr);
  pcVar6 = Wlc_PrsFindSymbol(pcVar5,'\'');
  if (pcVar6 == (char *)0x0) {
    iVar4 = atoi(pcVar5);
    iVar3 = Abc_Base2Log(iVar4 + 1);
    *pRange = iVar3;
    if (0x1f < iVar3) {
      __assert_fail("*pRange < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcReadVer.c"
                    ,0x24e,
                    "char *Wlc_PrsReadConstant(Wlc_Prs_t *, char *, Vec_Int_t *, int *, int *, int *)"
                   );
    }
    pcVar5 = pcVar5 + -1;
    do {
      pcVar6 = pcVar5 + 1;
      pcVar5 = pcVar5 + 1;
    } while (0xf5 < (byte)(*pcVar6 - 0x3aU));
    Vec_IntFill(vFanins,1,iVar4);
  }
  else {
    cVar1 = pcVar6[1];
    if (cVar1 == 's') {
      *pSigned = 1;
      cVar1 = pcVar6[2];
      pcVar6 = pcVar6 + 1;
    }
    if (cVar1 == 'h') {
      *pXValue = (uint)((pcVar6[2] & 0xdfU) == 0x58);
      Vec_IntFill(vFanins,(((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0),0);
      Abc_TtReadHexNumber((word *)vFanins->pArray,pcVar6 + 2);
      *pRange = uVar2;
      pcVar5 = pcVar6 + 1;
      do {
        pcVar5 = pcVar5 + 1;
        iVar4 = Wlc_PrsIsChar(pcVar5);
      } while (iVar4 != 0);
    }
    else if (cVar1 == 'b') {
      uVar9 = 0;
      Vec_IntFill(vFanins,(((int)uVar2 >> 5) + 1) - (uint)((uVar2 & 0x1f) == 0),0);
      uVar7 = 0;
      uVar8 = uVar2;
      if (0 < (int)uVar2) {
        uVar7 = (ulong)uVar2;
      }
      for (; uVar8 = uVar8 - 1, uVar7 != uVar9; uVar9 = uVar9 + 1) {
        cVar1 = pcVar6[uVar9 + 2];
        if (cVar1 != '0') {
          if (cVar1 != '1') {
            format = "Wrong digit in binary constant \"%c\".";
            goto LAB_002f700c;
          }
          vFanins->pArray[(int)uVar8 >> 5] =
               vFanins->pArray[(int)uVar8 >> 5] | 1 << ((byte)uVar8 & 0x1f);
        }
      }
      *pRange = uVar2;
      pcVar5 = pcVar6 + (long)(int)uVar2 + 2;
    }
    else {
      format = "Expecting hexadecimal constant and not \"%c\".";
LAB_002f700c:
      pcVar5 = (char *)0x0;
      Wlc_PrsWriteErrorMessage(p,pcVar6,format,(ulong)(uint)(int)cVar1);
    }
  }
  return pcVar5;
}

Assistant:

static inline char * Wlc_PrsReadConstant( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins, int * pRange, int * pSigned, int * pXValue )
{
    int i, nDigits, nBits = atoi( pStr );
    *pRange = -1;
    *pSigned = 0;
    *pXValue = 0;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( Wlc_PrsFindSymbol( pStr, '\'' ) == NULL )
    {
        // handle decimal number
        int Number = atoi( pStr );
        *pRange = Abc_Base2Log( Number+1 );
        assert( *pRange < 32 );
        while ( Wlc_PrsIsDigit(pStr) )
            pStr++;
        Vec_IntFill( vFanins, 1, Number );
        return pStr;
    }
    pStr = Wlc_PrsFindSymbol( pStr, '\'' );
    if ( pStr[1] == 's' )
    {
        *pSigned = 1;
        pStr++;
    }
    if ( pStr[1] == 'b' )
    {
        Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
        for ( i = 0; i < nBits; i++ )
            if ( pStr[2+i] == '1' )
                Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), nBits-1-i );
            else if ( pStr[2+i] != '0' )
                return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Wrong digit in binary constant \"%c\".", pStr[2+i] );
        *pRange = nBits;
        pStr += 2 + nBits;
        return pStr;
    }
    if ( pStr[1] != 'h' )
        return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Expecting hexadecimal constant and not \"%c\".", pStr[1] );
    *pXValue = (pStr[2] == 'x' || pStr[2] == 'X');
    if ( *pXValue == 'X' )
        *pXValue = 'x';
    Vec_IntFill( vFanins, Abc_BitWordNum(nBits), 0 );
    nDigits = Abc_TtReadHexNumber( (word *)Vec_IntArray(vFanins), pStr+2 );
    if ( nDigits != (nBits + 3)/4 )
    {
//        return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "The length of a constant does not match." );
//        printf( "Warning: The length of a constant (%d hex digits) does not match the number of bits (%d).\n", nDigits, nBits );
    }
    *pRange = nBits;
    pStr += 2;
    while ( Wlc_PrsIsChar(pStr) )
        pStr++;
    return pStr;
}